

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_
          (TlbExportVisitor *this,Compound *type,Field *field)

{
  string *psVar1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  string sStack_88;
  string local_68;
  string local_48;
  
  psVar1 = &this->m_indent;
  poVar2 = std::operator<<(this->m_stream,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,"<field name=\"");
  Typelib::Field::getName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)&sStack_88);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2," type=\"");
  Typelib::Field::getType();
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&local_48,&local_68);
  poVar2 = std::operator<<(poVar2,(string *)&local_48);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2," offset=\"");
  Typelib::Field::getOffset();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\">\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_88);
  poVar2 = std::operator<<(this->m_stream,(string *)psVar1);
  auVar3 = Typelib::Field::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
            (&sStack_88,auVar3._0_8_,auVar3._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_88);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&sStack_88);
  poVar2 = std::operator<<(this->m_stream,(string *)psVar1);
  std::operator<<(poVar2,"</field>\n");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Compound const& type, Field const& field)
    {
        m_stream
            << m_indent
            << "<field name=\"" << field.getName() << "\""
            << " type=\""   << xmlEscape(field.getType().getName())  << "\""
            << " offset=\"" << field.getOffset() << "\">\n";
        m_stream << m_indent << emitMetaData(field.getMetaData()) << "\n";
        m_stream << m_indent << "</field>\n";
        return true;
    }